

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockwidget.cpp
# Opt level: O2

QLayoutItem * __thiscall QDockWidgetLayout::takeAt(QDockWidgetLayout *this,int index)

{
  QLayoutItem *pQVar1;
  pointer ppQVar2;
  int iVar3;
  int i;
  long lVar4;
  
  lVar4 = 0;
  iVar3 = 0;
  do {
    if ((this->item_list).d.size == lVar4) {
      return (QLayoutItem *)0x0;
    }
    pQVar1 = (this->item_list).d.ptr[lVar4];
    if (pQVar1 != (QLayoutItem *)0x0) {
      if (iVar3 == index) {
        ppQVar2 = QList<QLayoutItem_*>::data(&this->item_list);
        ppQVar2[lVar4] = (QLayoutItem *)0x0;
        (**(code **)(*(long *)&this->super_QLayout + 0x70))(this);
        return pQVar1;
      }
      iVar3 = iVar3 + 1;
    }
    lVar4 = lVar4 + 1;
  } while( true );
}

Assistant:

QLayoutItem *QDockWidgetLayout::takeAt(int index)
{
    int j = 0;
    for (int i = 0; i < item_list.size(); ++i) {
        QLayoutItem *item = item_list.at(i);
        if (item == nullptr)
            continue;
        if (index == j) {
            item_list[i] = 0;
            invalidate();
            return item;
        }
        ++j;
    }
    return nullptr;
}